

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O0

uint __thiscall OpHelperBlock::Length(OpHelperBlock *this)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  uint32 uVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  bool local_29;
  uint local_1c;
  uint length;
  OpHelperBlock *this_local;
  
  if (this->opHelperLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x396,"(opHelperLabel)","opHelperLabel");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->opHelperEndInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x397,"(opHelperEndInstr)","opHelperEndInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar4 = IR::Instr::GetNumber(this->opHelperEndInstr);
  uVar5 = IR::Instr::GetNumber(&this->opHelperLabel->super_Instr);
  local_1c = uVar4 - uVar5;
  this_00 = this->opHelperEndInstr;
  IVar3 = IR::Instr::GetKind(this_00);
  local_29 = true;
  if (IVar3 != InstrKindLabel) {
    local_29 = IR::Instr::IsProfiledLabelInstr(this_00);
  }
  if (local_29 == false) {
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

uint OpHelperBlock::Length() const
{
    Assert(opHelperLabel);
    Assert(opHelperEndInstr);

    uint length = opHelperEndInstr->GetNumber() - opHelperLabel->GetNumber();
    if(!opHelperEndInstr->IsLabelInstr())
    {
        ++length;
    }
    return length;
}